

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

void __thiscall pmx::PmxFrame::Read(PmxFrame *this,istream *stream,PmxSetting *setting)

{
  type this_00;
  uint8_t in_CL;
  int local_6c;
  int i;
  string local_60;
  string local_40;
  PmxSetting *local_20;
  PmxSetting *setting_local;
  istream *stream_local;
  PmxFrame *this_local;
  
  local_20 = setting;
  setting_local = (PmxSetting *)stream;
  stream_local = (istream *)this;
  ReadString_abi_cxx11_(&local_40,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ReadString_abi_cxx11_(&local_60,(pmx *)setting_local,(istream *)(ulong)local_20->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->frame_english_name,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::istream::read((char *)setting_local,(long)&this->frame_flag);
  std::istream::read((char *)setting_local,(long)&this->element_count);
  mmd::make_unique<pmx::PmxFrameElement[]>
            ((mmd *)&stack0xffffffffffffff98,(long)this->element_count);
  std::unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_>::operator=
            (&this->elements,
             (unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_> *)
             &stack0xffffffffffffff98);
  std::unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_>::~unique_ptr
            ((unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_> *)
             &stack0xffffffffffffff98);
  for (local_6c = 0; local_6c < this->element_count; local_6c = local_6c + 1) {
    this_00 = std::unique_ptr<pmx::PmxFrameElement[],_std::default_delete<pmx::PmxFrameElement[]>_>
              ::operator[](&this->elements,(long)local_6c);
    PmxFrameElement::Read(this_00,(istream *)setting_local,local_20);
  }
  return;
}

Assistant:

void PmxFrame::Read(std::istream *stream, PmxSetting *setting)
	{
		this->frame_name = ReadString(stream, setting->encoding);
		this->frame_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &this->frame_flag, sizeof(uint8_t));
		stream->read((char*) &this->element_count, sizeof(int));
		this->elements = mmd::make_unique<PmxFrameElement []>(this->element_count);
		for (int i = 0; i < this->element_count; i++)
		{
			this->elements[i].Read(stream, setting);
		}
	}